

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

int lys_features_change(lys_module *module,char *name,int op)

{
  byte *pbVar1;
  lys_feature *plVar2;
  byte bVar3;
  lys_feature *plVar4;
  byte bVar5;
  int iVar6;
  lys_module *plVar7;
  ulong uVar8;
  ly_ctx *ctx;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  int local_48;
  int local_44;
  uint local_3c;
  int local_38;
  
  if (name == (char *)0x0 || module == (lys_module *)0x0) {
LAB_0016062c:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_features_change");
  }
  else {
    if (*name == '*') {
      bVar14 = name[1] != '\0';
    }
    else {
      bVar14 = true;
      if (*name == '\0') goto LAB_0016062c;
    }
    uVar8 = 0xffffffffffffffff;
    local_38 = 0;
    uVar13 = 0;
    do {
      do {
        plVar7 = module;
        if (uVar8 != 0xffffffffffffffff) {
          plVar7 = (lys_module *)module->inc[uVar8].submodule;
        }
        bVar3 = plVar7->features_size;
        local_3c = (uint)uVar13;
        if ((ulong)bVar3 != 0) {
          plVar4 = plVar7->features;
          uVar13 = 0;
          do {
            if ((bVar14 == false) || (iVar6 = strcmp(plVar4[uVar13].name,name), iVar6 == 0)) {
              if (op == 0) {
                if ((plVar4[uVar13].flags >> 8 & 1) != 0) {
                  lys_features_disable_recursive(plVar4 + uVar13);
                  local_38 = local_38 + 1;
                }
              }
              else if ((plVar4[uVar13].flags >> 8 & 1) == 0) {
                plVar2 = plVar4 + uVar13;
                if (plVar4[uVar13].iffeature_size == '\0') {
                  bVar5 = 0;
                  uVar11 = 0;
                }
                else {
                  lVar10 = 0;
                  uVar12 = 0;
                  do {
                    iVar6 = resolve_iffeature((lys_iffeature *)
                                              ((long)&plVar2->iffeature->expr + lVar10));
                    if (iVar6 == 0) {
                      if (bVar14 != false) {
                        ctx = module->ctx;
                        pcVar9 = plVar2->name;
                        uVar12 = (ulong)((int)uVar12 + 1);
                        goto LAB_0016084e;
                      }
                      local_3c = (int)uVar12 + 1;
                      bVar5 = plVar2->iffeature_size;
                      local_44 = (int)uVar8;
                      local_48 = (int)uVar13;
                      break;
                    }
                    uVar12 = uVar12 + 1;
                    bVar5 = plVar2->iffeature_size;
                    lVar10 = lVar10 + 0x20;
                  } while (uVar12 < bVar5);
                  uVar11 = (uint)uVar12;
                }
                if (uVar11 == bVar5) {
                  pbVar1 = (byte *)((long)&plVar2->flags + 1);
                  *pbVar1 = *pbVar1 | 1;
                  local_38 = local_38 + 1;
                }
              }
              if (bVar14 != false) {
                return 0;
              }
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != bVar3);
        }
        uVar8 = uVar8 + 1;
        uVar12 = (ulong)local_3c;
        uVar13 = uVar12;
      } while (uVar8 < module->inc_size);
      if (local_38 == 0) break;
      uVar8 = 0xffffffffffffffff;
      uVar13 = 0;
      local_38 = 0;
    } while (local_3c != 0);
    if (local_3c == 0) {
      return (uint)bVar14;
    }
    ctx = module->ctx;
    if (local_44 != -1) {
      module = (lys_module *)module->inc[local_44].submodule;
    }
    pcVar9 = module->features[local_48].name;
LAB_0016084e:
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Feature \"%s\" is disabled by its %d. if-feature condition.",
           pcVar9,uVar12);
  }
  return 1;
}

Assistant:

static int
lys_features_change(const struct lys_module *module, const char *name, int op)
{
    int all = 0;
    int i, j, k;
    int progress, faili, failj, failk;

    uint8_t fsize;
    struct lys_feature *f;

    if (!module || !name || !strlen(name)) {
        LOGARG;
        return EXIT_FAILURE;
    }

    if (!strcmp(name, "*")) {
        /* enable all */
        all = 1;
    }

    progress = failk = 1;
    while (progress && failk) {
        for (i = -1, failk = progress = 0; i < module->inc_size; i++) {
            if (i == -1) {
                fsize = module->features_size;
                f = module->features;
            } else {
                fsize = module->inc[i].submodule->features_size;
                f = module->inc[i].submodule->features;
            }

            for (j = 0; j < fsize; j++) {
                if (all || !strcmp(f[j].name, name)) {
                    if ((op && (f[j].flags & LYS_FENABLED)) || (!op && !(f[j].flags & LYS_FENABLED))) {
                        if (all) {
                            /* skip already set features */
                            continue;
                        } else {
                            /* feature already set correctly */
                            return EXIT_SUCCESS;
                        }
                    }

                    if (op) {
                        /* check referenced features if they are enabled */
                        for (k = 0; k < f[j].iffeature_size; k++) {
                            if (!resolve_iffeature(&f[j].iffeature[k])) {
                                if (all) {
                                    faili = i;
                                    failj = j;
                                    failk = k + 1;
                                    break;
                                } else {
                                    LOGERR(module->ctx, LY_EINVAL, "Feature \"%s\" is disabled by its %d. if-feature condition.",
                                           f[j].name, k + 1);
                                    return EXIT_FAILURE;
                                }
                            }
                        }

                        if (k == f[j].iffeature_size) {
                            /* the last check passed, do the change */
                            f[j].flags |= LYS_FENABLED;
                            progress++;
                        }
                    } else {
                        lys_features_disable_recursive(&f[j]);
                        progress++;
                    }
                    if (!all) {
                        /* stop in case changing a single feature */
                        return EXIT_SUCCESS;
                    }
                }
            }
        }
    }
    if (failk) {
        /* print info about the last failing feature */
        LOGERR(module->ctx, LY_EINVAL, "Feature \"%s\" is disabled by its %d. if-feature condition.",
               faili == -1 ? module->features[failj].name : module->inc[faili].submodule->features[failj].name, failk);
        return EXIT_FAILURE;
    }

    if (all) {
        return EXIT_SUCCESS;
    } else {
        /* the specified feature not found */
        return EXIT_FAILURE;
    }
}